

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::resetTestGroupResult(JUnitTestOutput *this)

{
  size_t sVar1;
  long in_RDI;
  JUnitTestCaseResultNode *tmp;
  JUnitTestCaseResultNode *cur;
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  JUnitTestCaseResultNode *this_00;
  size_t local_30;
  
  **(undefined8 **)(in_RDI + 0x20) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x20) + 8) = 0;
  SimpleString::SimpleString(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
  SimpleString::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  SimpleString::~SimpleString((SimpleString *)0x17b7b3);
  sVar1 = *(size_t *)(*(long *)(in_RDI + 0x20) + 0x38);
  while (local_30 = sVar1, local_30 != 0) {
    sVar1 = *(size_t *)(local_30 + 0x48);
    this_00 = *(JUnitTestCaseResultNode **)(local_30 + 0x18);
    if (this_00 != (JUnitTestCaseResultNode *)0x0) {
      (**(code **)((this_00->name_).buffer_ + 8))();
    }
    if (local_30 != 0) {
      JUnitTestCaseResultNode::~JUnitTestCaseResultNode(this_00);
      operator_delete(this_00,local_30);
    }
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x38) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x40) = 0;
  return;
}

Assistant:

void JUnitTestOutput::resetTestGroupResult()
{
    impl_->results_.testCount_ = 0;
    impl_->results_.failureCount_ = 0;
    impl_->results_.group_ = "";
    JUnitTestCaseResultNode* cur = impl_->results_.head_;
    while (cur) {
        JUnitTestCaseResultNode* tmp = cur->next_;
        delete cur->failure_;
        delete cur;
        cur = tmp;
    }
    impl_->results_.head_ = NULLPTR;
    impl_->results_.tail_ = NULLPTR;
}